

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.h
# Opt level: O2

void __thiscall
Deque<int,_std::allocator<int>_>::Deque
          (Deque<int,_std::allocator<int>_> *this,allocator<int> *allocator)

{
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::RingBuffer(&this->current_,8,&local_19);
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::RingBuffer(&this->small_,4,&local_1a);
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::RingBuffer(&this->big_,0x10,&local_1b);
  return;
}

Assistant:

Deque(const Allocator &allocator = Allocator()) :
            small_(MIN_BUFFER_SIZE),
            current_(MIN_BUFFER_SIZE * 2),
            big_(MIN_BUFFER_SIZE * 4),
            allocator_(allocator)
    {}